

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

void * LoadSDL20Symbol(char *fn,int *okay)

{
  void *pvVar1;
  char *dst;
  
  if (*okay != 0) {
    pvVar1 = (void *)dlsym(Loaded_SDL20,fn);
    if (pvVar1 == (void *)0x0) {
      dst = SDL12COMPAT_stpcpy(loaderror,fn);
      SDL12COMPAT_stpcpy(dst," missing in SDL2 library.");
      *okay = 0;
      pvVar1 = (void *)0x0;
    }
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

static void *
LoadSDL20Symbol(const char *fn, int *okay)
{
    void *retval = NULL;
    if (*okay) { /* only bother trying if we haven't previously failed. */
        retval = LookupSDL20Sym(fn);
        if (retval == NULL) {
            char *p = SDL12COMPAT_stpcpy(loaderror, fn);
            SDL12COMPAT_stpcpy(p, " missing in SDL2 library.");
            *okay = 0;
        }
    }
    return retval;
}